

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O2

void embree::sse2::performFallbackSplit
               (PrimRef *prims,PrimInfoRange *pinfo,PrimInfoRange *linfo,PrimInfoRange *rinfo)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  Vec3fx VVar5;
  unsigned_long uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  uVar6 = (pinfo->super_range<unsigned_long>)._begin;
  uVar7 = (pinfo->super_range<unsigned_long>)._end;
  uVar13 = uVar7 + uVar6 >> 1;
  paVar12 = &prims[uVar6].upper.field_0;
  aVar16 = _DAT_01f45a40;
  aVar17 = _DAT_01f45a30;
  aVar18 = _DAT_01f45a40;
  aVar19 = _DAT_01f45a30;
  for (uVar15 = uVar6; uVar15 < uVar13; uVar15 = uVar15 + 1) {
    aVar2 = paVar12[-1].field_1;
    aVar3 = paVar12->field_1;
    aVar19.m128 = (__m128)minps(aVar19.m128,(undefined1  [16])aVar2);
    aVar18.m128 = (__m128)maxps(aVar18.m128,(undefined1  [16])aVar3);
    fVar20 = aVar2.x + aVar3.x;
    fVar21 = aVar2.y + aVar3.y;
    fVar22 = aVar2.z + aVar3.z;
    fVar23 = aVar2.field_3.w + aVar3.field_3.w;
    auVar8._4_4_ = fVar21;
    auVar8._0_4_ = fVar20;
    auVar8._8_4_ = fVar22;
    auVar8._12_4_ = fVar23;
    aVar17.m128 = (__m128)minps(aVar17.m128,auVar8);
    auVar9._4_4_ = fVar21;
    auVar9._0_4_ = fVar20;
    auVar9._8_4_ = fVar22;
    auVar9._12_4_ = fVar23;
    aVar16.m128 = (__m128)maxps(aVar16.m128,auVar9);
    paVar12 = paVar12 + 2;
  }
  (linfo->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar19;
  (linfo->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar18;
  (linfo->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar17;
  (linfo->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar16;
  (linfo->super_range<unsigned_long>)._begin = uVar6;
  (linfo->super_range<unsigned_long>)._end = uVar13;
  paVar12 = &prims[uVar13].upper.field_0;
  aVar16 = _DAT_01f45a40;
  aVar17 = _DAT_01f45a30;
  aVar18 = _DAT_01f45a40;
  aVar19 = _DAT_01f45a30;
  for (uVar14 = uVar13; uVar14 < uVar7; uVar14 = uVar14 + 1) {
    paVar1 = paVar12 + -1;
    auVar4._0_4_ = *(float *)paVar1;
    auVar4._4_4_ = *(float *)((long)paVar1 + 4);
    auVar4._8_4_ = *(float *)((long)paVar1 + 8);
    auVar4._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar5.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar12->field_1;
    aVar19.m128 = (__m128)minps(aVar19.m128,auVar4);
    aVar18.m128 = (__m128)maxps(aVar18.m128,(undefined1  [16])VVar5.field_0);
    fVar20 = (float)auVar4._0_4_ + VVar5.field_0._0_4_;
    fVar21 = (float)auVar4._4_4_ + VVar5.field_0._4_4_;
    fVar22 = (float)auVar4._8_4_ + VVar5.field_0._8_4_;
    fVar23 = (float)auVar4._12_4_ + VVar5.field_0._12_4_;
    auVar10._4_4_ = fVar21;
    auVar10._0_4_ = fVar20;
    auVar10._8_4_ = fVar22;
    auVar10._12_4_ = fVar23;
    aVar17.m128 = (__m128)minps(aVar17.m128,auVar10);
    auVar11._4_4_ = fVar21;
    auVar11._0_4_ = fVar20;
    auVar11._8_4_ = fVar22;
    auVar11._12_4_ = fVar23;
    aVar16.m128 = (__m128)maxps(aVar16.m128,auVar11);
    paVar12 = paVar12 + 2;
  }
  (rinfo->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar19;
  (rinfo->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar18;
  (rinfo->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar17;
  (rinfo->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar16;
  (rinfo->super_range<unsigned_long>)._begin = uVar13;
  (rinfo->super_range<unsigned_long>)._end = uVar7;
  return;
}

Assistant:

__forceinline Ty begin() const {
        return _begin;
      }